

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::decideNextBranch(Solver *this,double f)

{
  ValueRep VVar1;
  uint32 uVar2;
  int iVar3;
  uint uVar4;
  DecisionHeuristic *this_00;
  fd_set *in_RCX;
  fd_set *__readfds;
  Solver *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  double in_XMM0_Qa;
  double dVar5;
  Literal *in_stack_00000010;
  uint32 v;
  uint32 maxVar;
  Literal choice;
  Var in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  Literal local_1c;
  double local_18;
  bool local_1;
  
  if (((in_XMM0_Qa <= 0.0) ||
      (local_18 = in_XMM0_Qa, dVar5 = RNG::drand((RNG *)0x1ef19e), local_18 <= dVar5)) ||
     (uVar2 = numFreeVars((Solver *)0x1ef1b0), uVar2 == 0)) {
    iVar3 = (int)in_RDI;
    this_00 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                        ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1ef1c3);
    iVar3 = DecisionHeuristic::select(this_00,iVar3,__readfds,in_RCX,in_R8,in_R9);
    local_1 = (bool)((byte)iVar3 & 1);
  }
  else {
    Literal::Literal(&local_1c);
    uVar2 = numVars((Solver *)0x1ef1ef);
    uVar4 = RNG::irand(&in_RDI->rng,in_stack_ffffffffffffffcc);
    while (VVar1 = value(in_RDI,in_stack_ffffffffffffffcc), VVar1 != '\0') {
      uVar4 = uVar4 + 1;
      if (uVar4 == uVar2 + 1) {
        uVar4 = 1;
      }
    }
    SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1ef22c);
    local_1c = DecisionHeuristic::selectLiteral
                         ((Solver *)CONCAT44(uVar4,in_stack_ffffffffffffffd8),
                          (Var)((ulong)in_RDI >> 0x20),(int)in_RDI);
    local_1 = assume(_maxVar,in_stack_00000010);
  }
  return local_1;
}

Assistant:

bool Solver::decideNextBranch(double f) {
	if (f <= 0.0 || rng.drand() >= f || numFreeVars() == 0) {
		return heuristic_->select(*this);
	}
	// select randomly
	Literal choice;
	uint32 maxVar = numVars() + 1;
	for (uint32 v = rng.irand(maxVar);;) {
		if (value(v) == value_free) {
			choice    = heuristic_->selectLiteral(*this, v, 0);
			break;
		}
		if (++v == maxVar) { v = 1; }
	}
	return assume(choice);
}